

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_info_cert_type(char **buf,size_t *size,uchar ns_cert_type)

{
  int iVar1;
  char *local_40;
  char *sep;
  char *p;
  size_t n;
  int ret;
  uchar ns_cert_type_local;
  size_t *size_local;
  char **buf_local;
  
  p = (char *)*size;
  sep = *buf;
  local_40 = anon_var_dwarf_260822 + 9;
  if ((ns_cert_type & 0x80) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sSSL Client",anon_var_dwarf_260822 + 9);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 0x40) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sSSL Server",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 0x20) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sEmail",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 0x10) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sObject Signing",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 8) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sReserved",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 4) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sSSL CA",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 2) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sEmail CA",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((ns_cert_type & 1) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sObject Signing CA",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
  }
  *size = (size_t)p;
  *buf = sep;
  return 0;
}

Assistant:

int mbedtls_x509_info_cert_type(char **buf, size_t *size,
                                unsigned char ns_cert_type)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n = *size;
    char *p = *buf;
    const char *sep = "";

    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_SSL_CLIENT,         "SSL Client");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_SSL_SERVER,         "SSL Server");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_EMAIL,              "Email");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_OBJECT_SIGNING,     "Object Signing");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_RESERVED,           "Reserved");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_SSL_CA,             "SSL CA");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_EMAIL_CA,           "Email CA");
    CERT_TYPE(MBEDTLS_X509_NS_CERT_TYPE_OBJECT_SIGNING_CA,  "Object Signing CA");

    *size = n;
    *buf = p;

    return 0;
}